

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Function_Type.cxx
# Opt level: O3

void write_public(int state)

{
  Fl_Widget_Class_Type *pFVar1;
  
  pFVar1 = current_widget_class;
  if (((current_class != (Fl_Class_Type *)0x0 || current_widget_class != (Fl_Widget_Class_Type *)0x0
       ) && ((current_class == (Fl_Class_Type *)0x0 || (current_class->write_public_state != state))
            )) &&
     ((current_widget_class == (Fl_Widget_Class_Type *)0x0 ||
      (current_widget_class->write_public_state != state)))) {
    if (current_class != (Fl_Class_Type *)0x0) {
      current_class->write_public_state = (char)state;
    }
    if (pFVar1 != (Fl_Widget_Class_Type *)0x0) {
      pFVar1->write_public_state = (char)state;
    }
    if ((uint)state < 3) {
      write_h(&DAT_002102e4 + *(int *)(&DAT_002102e4 + (ulong)(uint)state * 4));
      return;
    }
  }
  return;
}

Assistant:

void write_public(int state) {
  if (!current_class && !current_widget_class) return;
  if (current_class && current_class->write_public_state == state) return;
  if (current_widget_class && current_widget_class->write_public_state == state) return;
  if (current_class) current_class->write_public_state = state;
  if (current_widget_class) current_widget_class->write_public_state = state;
  switch (state) {
    case 0: write_h("private:\n"); break;
    case 1: write_h("public:\n"); break;
    case 2: write_h("protected:\n"); break;
  }
}